

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall cmake::Configure(cmake *this)

{
  cmCacheManager *this_00;
  cmState *this_01;
  int iVar1;
  char *pcVar2;
  allocator local_39;
  string local_38;
  
  if (this->DoSuppressDevWarnings == true) {
    this_00 = this->CacheManager;
    if (this->SuppressDevWarnings == true) {
      std::__cxx11::string::string
                ((string *)&local_38,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_39);
      cmCacheManager::AddCacheEntry
                (this_00,&local_38,"TRUE",
                 "Suppress Warnings that are meant for the author of the CMakeLists.txt files.",
                 INTERNAL);
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_38,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_39);
      cmCacheManager::AddCacheEntry
                (this_00,&local_38,"FALSE",
                 "Suppress Warnings that are meant for the author of the CMakeLists.txt files.",
                 INTERNAL);
    }
    std::__cxx11::string::~string((string *)&local_38);
  }
  iVar1 = ActualConfigure(this);
  this_01 = this->State;
  std::__cxx11::string::string((string *)&local_38,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",&local_39);
  pcVar2 = cmState::GetGlobalProperty(this_01,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if ((pcVar2 != (char *)0x0) && (*pcVar2 != '\0')) {
    std::__cxx11::string::string((string *)&local_38,pcVar2,&local_39);
    iVar1 = HandleDeleteCacheVariables(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return iVar1;
}

Assistant:

int cmake::Configure()
{
  if(this->DoSuppressDevWarnings)
    {
    if(this->SuppressDevWarnings)
      {
      this->CacheManager->
        AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS", "TRUE",
                      "Suppress Warnings that are meant for"
                      " the author of the CMakeLists.txt files.",
                      cmState::INTERNAL);
      }
    else
      {
      this->CacheManager->
        AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS", "FALSE",
                      "Suppress Warnings that are meant for"
                      " the author of the CMakeLists.txt files.",
                      cmState::INTERNAL);
      }
    }
  int ret = this->ActualConfigure();
  const char* delCacheVars = this->State
                    ->GetGlobalProperty("__CMAKE_DELETE_CACHE_CHANGE_VARS_");
  if(delCacheVars && delCacheVars[0] != 0)
    {
    return this->HandleDeleteCacheVariables(delCacheVars);
    }
  return ret;

}